

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetScrollFromPosY(float pos_y,float center_y_ratio)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if ((0.0 <= center_y_ratio) && (center_y_ratio <= 1.0)) {
    fVar2 = (float)(int)(pos_y + (pIVar1->Scroll).y);
    (pIVar1->ScrollTarget).y = fVar2;
    if ((center_y_ratio <= 0.0) && (fVar2 <= (pIVar1->WindowPadding).y)) {
      (pIVar1->ScrollTarget).y = 0.0;
    }
    (pIVar1->ScrollTargetCenterRatio).y = center_y_ratio;
    return;
  }
  __assert_fail("center_y_ratio >= 0.0f && center_y_ratio <= 1.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x14fb,"void ImGui::SetScrollFromPosY(float, float)");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }